

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O2

FT_Error FT_Outline_Decompose(FT_Outline *outline,FT_Outline_Funcs *func_interface,void *user)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  FT_Vector *pFVar8;
  FT_Vector *pFVar9;
  byte *pbVar10;
  FT_Vector v_start;
  FT_Vector local_a8;
  FT_Vector *local_98;
  uint local_8c;
  FT_Vector vec1;
  FT_Vector v_control;
  FT_Vector vec2;
  FT_Vector vec;
  
  iVar4 = 0x14;
  if (outline != (FT_Outline *)0x0) {
    if (func_interface == (FT_Outline_Funcs *)0x0) {
      iVar4 = 6;
    }
    else {
      iVar1 = func_interface->shift;
      lVar2 = func_interface->delta;
      lVar7 = 0;
      uVar6 = 0;
LAB_00135e0b:
      if (lVar7 < outline->n_contours) {
        local_8c = (uint)outline->contours[lVar7];
        if (outline->contours[lVar7] < 0) {
LAB_0013617f:
          iVar4 = 0x14;
        }
        else {
          pFVar9 = outline->points;
          local_98 = pFVar9 + local_8c;
          bVar5 = (byte)iVar1;
          pFVar8 = pFVar9 + uVar6;
          v_control.x = (pFVar9[uVar6].x << (bVar5 & 0x3f)) - lVar2;
          v_control.y = (pFVar9[uVar6].y << (bVar5 & 0x3f)) - lVar2;
          pcVar3 = outline->tags;
          pbVar10 = (byte *)(pcVar3 + uVar6);
          if ((pcVar3[uVar6] & 3U) == 0) {
            local_a8.x = (pFVar9[local_8c].x << (bVar5 & 0x3f)) - lVar2;
            local_a8.y = (pFVar9[local_8c].y << (bVar5 & 0x3f)) - lVar2;
            if ((pcVar3[local_8c] & 3U) == 1) {
              local_98 = local_98 + -1;
            }
            else {
              local_a8.x = (local_a8.x + v_control.x) / 2;
              local_a8.y = (local_a8.y + v_control.y) / 2;
            }
            pFVar8 = pFVar8 + -1;
            pbVar10 = pbVar10 + -1;
          }
          else {
            local_a8.x = v_control.x;
            local_a8.y = v_control.y;
            if ((pcVar3[uVar6] & 3U) == 2) goto LAB_0013617f;
          }
          iVar4 = (*func_interface->move_to)(&local_a8,user);
          while (pFVar9 = pFVar8, iVar4 == 0) {
LAB_00135f18:
            if (local_98 <= pFVar9) {
              iVar4 = (*func_interface->line_to)(&local_a8,user);
LAB_00136153:
              if (iVar4 != 0) {
                return iVar4;
              }
              uVar6 = local_8c + 1;
              lVar7 = lVar7 + 1;
              goto LAB_00135e0b;
            }
            if ((pbVar10[1] & 3) == 0) {
              v_control.x = (pFVar9[1].x << (bVar5 & 0x3f)) - lVar2;
              v_control.y = (pFVar9[1].y << (bVar5 & 0x3f)) - lVar2;
              pFVar9 = pFVar9 + 2;
              pbVar10 = pbVar10 + 2;
              while( true ) {
                if (local_98 <= pFVar9 + -1) {
                  iVar4 = (*func_interface->conic_to)(&v_control,&local_a8,user);
                  goto LAB_00136153;
                }
                vec1.x = (pFVar9->x << (bVar5 & 0x3f)) - lVar2;
                vec1.y = (pFVar9->y << (bVar5 & 0x3f)) - lVar2;
                if ((*pbVar10 & 3) != 0) break;
                vec2.x = (vec1.x + v_control.x) / 2;
                vec2.y = (vec1.y + v_control.y) / 2;
                iVar4 = (*func_interface->conic_to)(&v_control,&vec2,user);
                if (iVar4 != 0) goto LAB_00136177;
                v_control.x = vec1.x;
                v_control.y = vec1.y;
                pFVar9 = pFVar9 + 1;
                pbVar10 = pbVar10 + 1;
              }
              if ((*pbVar10 & 3) != 1) goto LAB_00136173;
              iVar4 = (*func_interface->conic_to)(&v_control,&vec1,user);
              if (iVar4 != 0) {
LAB_00136177:
                iVar1 = 10;
LAB_00136179:
                if (iVar1 != 7) {
                  return iVar4;
                }
                goto LAB_0013617f;
              }
              goto LAB_00135f18;
            }
            if ((pbVar10[1] & 3) != 1) {
              if ((local_98 < pFVar9 + 2) || ((pbVar10[2] & 3) != 2)) {
LAB_00136173:
                iVar4 = 0;
                iVar1 = 7;
                goto LAB_00136179;
              }
              vec1.x = (pFVar9[1].x << (bVar5 & 0x3f)) - lVar2;
              vec1.y = (pFVar9[1].y << (bVar5 & 0x3f)) - lVar2;
              vec2.x = (pFVar9[2].x << (bVar5 & 0x3f)) - lVar2;
              vec2.y = (pFVar9[2].y << (bVar5 & 0x3f)) - lVar2;
              if (local_98 < pFVar9 + 3) {
                iVar4 = (*func_interface->cubic_to)(&vec1,&vec2,&local_a8,user);
                goto LAB_00136153;
              }
              vec.x = (pFVar9[3].x << (bVar5 & 0x3f)) - lVar2;
              vec.y = (pFVar9[3].y << (bVar5 & 0x3f)) - lVar2;
              iVar4 = (*func_interface->cubic_to)(&vec1,&vec2,&vec,user);
              if (iVar4 != 0) goto LAB_00136177;
              pbVar10 = pbVar10 + 3;
              pFVar9 = pFVar9 + 3;
              goto LAB_00135f18;
            }
            vec1.x = (pFVar9[1].x << (bVar5 & 0x3f)) - lVar2;
            pFVar8 = pFVar9 + 1;
            pbVar10 = pbVar10 + 1;
            vec1.y = (pFVar9[1].y << (bVar5 & 0x3f)) - lVar2;
            iVar4 = (*func_interface->line_to)(&vec1,user);
          }
        }
      }
      else {
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Decompose( FT_Outline*              outline,
                        const FT_Outline_Funcs*  func_interface,
                        void*                    user )
  {
#undef  SCALED
#define SCALED( x )  ( ( (x) < 0 ? -( -(x) << shift )             \
                                 :  (  (x) << shift ) ) - delta )

    FT_Vector   v_last;
    FT_Vector   v_control;
    FT_Vector   v_start;

    FT_Vector*  point;
    FT_Vector*  limit;
    char*       tags;

    FT_Error    error;

    FT_Int   n;         /* index of contour in outline     */
    FT_UInt  first;     /* index of first point in contour */
    FT_Int   tag;       /* current point's state           */

    FT_Int   shift;
    FT_Pos   delta;


    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !func_interface )
      return FT_THROW( Invalid_Argument );

    shift = func_interface->shift;
    delta = func_interface->delta;
    first = 0;

    for ( n = 0; n < outline->n_contours; n++ )
    {
      FT_Int  last;  /* index of last point in contour */


      FT_TRACE5(( "FT_Outline_Decompose: Outline %d\n", n ));

      last = outline->contours[n];
      if ( last < 0 )
        goto Invalid_Outline;
      limit = outline->points + last;

      v_start   = outline->points[first];
      v_start.x = SCALED( v_start.x );
      v_start.y = SCALED( v_start.y );

      v_last   = outline->points[last];
      v_last.x = SCALED( v_last.x );
      v_last.y = SCALED( v_last.y );

      v_control = v_start;

      point = outline->points + first;
      tags  = outline->tags   + first;
      tag   = FT_CURVE_TAG( tags[0] );

      /* A contour cannot start with a cubic control point! */
      if ( tag == FT_CURVE_TAG_CUBIC )
        goto Invalid_Outline;

      /* check first point to determine origin */
      if ( tag == FT_CURVE_TAG_CONIC )
      {
        /* first point is conic control.  Yes, this happens. */
        if ( FT_CURVE_TAG( outline->tags[last] ) == FT_CURVE_TAG_ON )
        {
          /* start at last point if it is on the curve */
          v_start = v_last;
          limit--;
        }
        else
        {
          /* if both first and last points are conic,         */
          /* start at their middle and record its position    */
          /* for closure                                      */
          v_start.x = ( v_start.x + v_last.x ) / 2;
          v_start.y = ( v_start.y + v_last.y ) / 2;

       /* v_last = v_start; */
        }
        point--;
        tags--;
      }

      FT_TRACE5(( "  move to (%.2f, %.2f)\n",
                  v_start.x / 64.0, v_start.y / 64.0 ));
      error = func_interface->move_to( &v_start, user );
      if ( error )
        goto Exit;

      while ( point < limit )
      {
        point++;
        tags++;

        tag = FT_CURVE_TAG( tags[0] );
        switch ( tag )
        {
        case FT_CURVE_TAG_ON:  /* emit a single line_to */
          {
            FT_Vector  vec;


            vec.x = SCALED( point->x );
            vec.y = SCALED( point->y );

            FT_TRACE5(( "  line to (%.2f, %.2f)\n",
                        vec.x / 64.0, vec.y / 64.0 ));
            error = func_interface->line_to( &vec, user );
            if ( error )
              goto Exit;
            continue;
          }

        case FT_CURVE_TAG_CONIC:  /* consume conic arcs */
          v_control.x = SCALED( point->x );
          v_control.y = SCALED( point->y );

        Do_Conic:
          if ( point < limit )
          {
            FT_Vector  vec;
            FT_Vector  v_middle;


            point++;
            tags++;
            tag = FT_CURVE_TAG( tags[0] );

            vec.x = SCALED( point->x );
            vec.y = SCALED( point->y );

            if ( tag == FT_CURVE_TAG_ON )
            {
              FT_TRACE5(( "  conic to (%.2f, %.2f)"
                          " with control (%.2f, %.2f)\n",
                          vec.x / 64.0, vec.y / 64.0,
                          v_control.x / 64.0, v_control.y / 64.0 ));
              error = func_interface->conic_to( &v_control, &vec, user );
              if ( error )
                goto Exit;
              continue;
            }

            if ( tag != FT_CURVE_TAG_CONIC )
              goto Invalid_Outline;

            v_middle.x = ( v_control.x + vec.x ) / 2;
            v_middle.y = ( v_control.y + vec.y ) / 2;

            FT_TRACE5(( "  conic to (%.2f, %.2f)"
                        " with control (%.2f, %.2f)\n",
                        v_middle.x / 64.0, v_middle.y / 64.0,
                        v_control.x / 64.0, v_control.y / 64.0 ));
            error = func_interface->conic_to( &v_control, &v_middle, user );
            if ( error )
              goto Exit;

            v_control = vec;
            goto Do_Conic;
          }

          FT_TRACE5(( "  conic to (%.2f, %.2f)"
                      " with control (%.2f, %.2f)\n",
                      v_start.x / 64.0, v_start.y / 64.0,
                      v_control.x / 64.0, v_control.y / 64.0 ));
          error = func_interface->conic_to( &v_control, &v_start, user );
          goto Close;

        default:  /* FT_CURVE_TAG_CUBIC */
          {
            FT_Vector  vec1, vec2;


            if ( point + 1 > limit                             ||
                 FT_CURVE_TAG( tags[1] ) != FT_CURVE_TAG_CUBIC )
              goto Invalid_Outline;

            point += 2;
            tags  += 2;

            vec1.x = SCALED( point[-2].x );
            vec1.y = SCALED( point[-2].y );

            vec2.x = SCALED( point[-1].x );
            vec2.y = SCALED( point[-1].y );

            if ( point <= limit )
            {
              FT_Vector  vec;


              vec.x = SCALED( point->x );
              vec.y = SCALED( point->y );

              FT_TRACE5(( "  cubic to (%.2f, %.2f)"
                          " with controls (%.2f, %.2f) and (%.2f, %.2f)\n",
                          vec.x / 64.0, vec.y / 64.0,
                          vec1.x / 64.0, vec1.y / 64.0,
                          vec2.x / 64.0, vec2.y / 64.0 ));
              error = func_interface->cubic_to( &vec1, &vec2, &vec, user );
              if ( error )
                goto Exit;
              continue;
            }

            FT_TRACE5(( "  cubic to (%.2f, %.2f)"
                        " with controls (%.2f, %.2f) and (%.2f, %.2f)\n",
                        v_start.x / 64.0, v_start.y / 64.0,
                        vec1.x / 64.0, vec1.y / 64.0,
                        vec2.x / 64.0, vec2.y / 64.0 ));
            error = func_interface->cubic_to( &vec1, &vec2, &v_start, user );
            goto Close;
          }
        }
      }

      /* close the contour with a line segment */
      FT_TRACE5(( "  line to (%.2f, %.2f)\n",
                  v_start.x / 64.0, v_start.y / 64.0 ));
      error = func_interface->line_to( &v_start, user );

    Close:
      if ( error )
        goto Exit;

      first = (FT_UInt)last + 1;
    }

    FT_TRACE5(( "FT_Outline_Decompose: Done\n", n ));
    return FT_Err_Ok;

  Exit:
    FT_TRACE5(( "FT_Outline_Decompose: Error 0x%x\n", error ));
    return error;

  Invalid_Outline:
    return FT_THROW( Invalid_Outline );
  }